

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O2

void * rw::destroyHAnim(void *object,int32 offset,int32 param_3)

{
  HAnimHierarchy *this;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  lVar3 = (long)offset;
  this = *(HAnimHierarchy **)((long)object + lVar3 + 8);
  if (this != (HAnimHierarchy *)0x0) {
    uVar1 = 0;
    uVar2 = (ulong)(uint)this->numNodes;
    if (this->numNodes < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 * 0x18 - uVar1 != 0; uVar1 = uVar1 + 0x18) {
      *(undefined8 *)((long)&this->nodeInfo->frame + uVar1) = 0;
    }
    if (this->parentFrame == (Frame *)object) {
      HAnimHierarchy::destroy(this);
    }
  }
  *(undefined4 *)((long)object + lVar3) = 0xffffffff;
  *(undefined8 *)((long)object + lVar3 + 8) = 0;
  return object;
}

Assistant:

static void*
destroyHAnim(void *object, int32 offset, int32)
{
	int i;
	HAnimData *hanim = PLUGINOFFSET(HAnimData, object, offset);
	if(hanim->hierarchy){
		for(i = 0; i < hanim->hierarchy->numNodes; i++)
			hanim->hierarchy->nodeInfo[i].frame = nil;
		if(object == hanim->hierarchy->parentFrame)
			hanim->hierarchy->destroy();
	}
	hanim->id = -1;
	hanim->hierarchy = nil;
	return object;
}